

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc_test.cc
# Opt level: O0

int anon_unknown.dwarf_22ecb::RcExternMethodsInterfaceTest_GetQpRateControllerTest_Test::
    AddToRegistry(void)

{
  CodeLocation *this;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::RcExternMethodsInterfaceTest> *a_file;
  TestMetaFactory<(anonymous_namespace)::RcExternMethodsInterfaceTest_GetQpRateControllerTest_Test>
  *this_00;
  ParameterizedTestSuiteRegistry *unaff_retaddr;
  undefined8 in_stack_ffffffffffffff30;
  int iVar1;
  string *in_stack_ffffffffffffff38;
  allocator local_a9;
  string local_a8 [72];
  CodeLocation *in_stack_ffffffffffffffa0;
  TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_int>_>
  *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::RcExternMethodsInterfaceTest>
  *in_stack_ffffffffffffffc0;
  CodeLocation *in_stack_fffffffffffffff0;
  char *in_stack_fffffffffffffff8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  testing::UnitTest::GetInstance();
  this = (CodeLocation *)testing::UnitTest::parameterized_test_registry((UnitTest *)0x12f364);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/ratectrl_rtc_test.cc"
             ,(allocator *)&stack0xffffffffffffffb7);
  testing::internal::CodeLocation::CodeLocation(this,in_stack_ffffffffffffff38,iVar1);
  a_file = testing::internal::ParameterizedTestSuiteRegistry::
           GetTestSuitePatternHolder<(anonymous_namespace)::RcExternMethodsInterfaceTest>
                     (unaff_retaddr,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
  this_00 = (TestMetaFactory<(anonymous_namespace)::RcExternMethodsInterfaceTest_GetQpRateControllerTest_Test>
             *)operator_new(8);
  testing::internal::
  TestMetaFactory<(anonymous_namespace)::RcExternMethodsInterfaceTest_GetQpRateControllerTest_Test>
  ::TestMetaFactory(this_00);
  iVar1 = (int)((ulong)this_00 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/ratectrl_rtc_test.cc"
             ,&local_a9);
  testing::internal::CodeLocation::CodeLocation(this,(string *)a_file,iVar1);
  testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::RcExternMethodsInterfaceTest>
  ::AddTestPattern(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  testing::internal::CodeLocation::~CodeLocation((CodeLocation *)0x12f458);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  testing::internal::CodeLocation::~CodeLocation((CodeLocation *)0x12f479);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  return 0;
}

Assistant:

TEST_P(RcExternMethodsInterfaceTest, GetQpRateControllerTest) {
  TestGetQPRateControl();
}